

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O1

void __thiscall
MempoolAcceptResult::MempoolAcceptResult
          (MempoolAcceptResult *this,
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *replaced_txns,int64_t vsize,CAmount fees,CFeeRate effective_feerate,
          vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          *wtxids_fee_calculations)

{
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *plVar1;
  long lVar2;
  _List_node_base *p_Var3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_result_type = VALID;
  (this->m_state).super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  (this->m_state).super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  (this->m_state).super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&(this->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  (this->m_state).super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  (this->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0]
       = '\0';
  (this->m_state).super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&(this->m_state).super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  (this->m_state).super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
  (this->m_state).super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0]
       = '\0';
  plVar1 = &this->m_replaced_transactions;
  (this->m_replaced_transactions).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (replaced_txns->
       super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl._M_node.super__List_node_base._M_next;
  p_Var3 = (replaced_txns->
           super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  (this->m_replaced_transactions).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = p_Var3;
  (this->m_replaced_transactions).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node._M_size =
       (replaced_txns->
       super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl._M_node._M_size;
  if ((replaced_txns->
      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)replaced_txns) {
    (this->m_replaced_transactions).
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (this->m_replaced_transactions).
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  }
  else {
    p_Var3->_M_next = (_List_node_base *)plVar1;
    ((plVar1->
     super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
     )._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)plVar1;
    (replaced_txns->
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)replaced_txns;
    (replaced_txns->
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)replaced_txns;
    (replaced_txns->
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    )._M_impl._M_node._M_size = 0;
  }
  (this->m_vsize).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = vsize;
  (this->m_vsize).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  (this->m_base_fees).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = fees;
  (this->m_base_fees).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  (this->m_effective_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK =
       effective_feerate.nSatoshisPerK;
  (this->m_effective_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = true;
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )&this->m_wtxids_fee_calculations,wtxids_fee_calculations);
  (this->m_wtxids_fee_calculations).
  super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  ._M_engaged = true;
  (this->m_other_wtxid).super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit MempoolAcceptResult(std::list<CTransactionRef>&& replaced_txns,
                                 int64_t vsize,
                                 CAmount fees,
                                 CFeeRate effective_feerate,
                                 const std::vector<Wtxid>& wtxids_fee_calculations)
        : m_result_type(ResultType::VALID),
        m_replaced_transactions(std::move(replaced_txns)),
        m_vsize{vsize},
        m_base_fees(fees),
        m_effective_feerate(effective_feerate),
        m_wtxids_fee_calculations(wtxids_fee_calculations) {}